

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void putcontig8bitYCbCr21tile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  TIFFRGBAImage *pTVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  bool bVar9;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t local_68;
  uint local_64;
  uint32_t local_60;
  uint local_5c;
  TIFFRGBAImage *local_58;
  uint32_t *local_50;
  long local_48;
  long local_40;
  uint32_t *local_38;
  
  local_40 = (long)toskew;
  local_64 = w >> 1;
  local_48 = (long)(fromskew / 2 << 2);
  local_60 = w;
  local_58 = img;
  do {
    lVar6 = 0;
    uVar5 = local_64;
    local_68 = h;
    local_50 = cp;
    while (pTVar2 = local_58, bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, bVar9) {
      bVar1 = pp[lVar6 + 2];
      local_5c = (uint)pp[lVar6 + 3];
      local_38 = cp;
      TIFFYCbCrtoRGB(local_58->ycbcr,(uint)pp[lVar6],(uint)bVar1,local_5c,&r,&g,&b);
      puVar4 = local_38;
      puVar3 = local_50;
      *(uint32_t *)((long)local_50 + lVar6 * 2) = b << 0x10 | 0xff000000 | g << 8 | r;
      TIFFYCbCrtoRGB(pTVar2->ycbcr,(uint)pp[lVar6 + 1],(uint)bVar1,local_5c,&r,&g,&b);
      *(uint32_t *)((long)puVar3 + lVar6 * 2 + 4) = b << 0x10 | 0xff000000 | g << 8 | r;
      cp = puVar4 + 2;
      lVar6 = lVar6 + 4;
    }
    if ((local_60 & 1) == 0) {
      pbVar7 = pp + lVar6;
    }
    else {
      pbVar8 = pp + lVar6;
      pbVar7 = pbVar8 + 4;
      TIFFYCbCrtoRGB(local_58->ycbcr,(uint)*pbVar8,(uint)pbVar8[2],(uint)pbVar8[3],&r,&g,&b);
      *(uint32_t *)((long)local_50 + lVar6 * 2) = g << 8 | r | b << 0x10 | 0xff000000;
      cp = cp + 1;
    }
    pp = pbVar7 + local_48;
    cp = cp + local_40;
    h = local_68 - 1;
  } while (h != 0);
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitYCbCr21tile)
{
    (void)y;
    fromskew = (fromskew / 2) * (2 * 1 + 2);
    do
    {
        x = w >> 1;
        while (x > 0)
        {
            int32_t Cb = pp[2];
            int32_t Cr = pp[3];

            YCbCrtoRGB(cp[0], pp[0]);
            YCbCrtoRGB(cp[1], pp[1]);

            cp += 2;
            pp += 4;
            x--;
        }

        if ((w & 1) != 0)
        {
            int32_t Cb = pp[2];
            int32_t Cr = pp[3];

            YCbCrtoRGB(cp[0], pp[0]);

            cp += 1;
            pp += 4;
        }

        cp += toskew;
        pp += fromskew;
    } while (--h);
}